

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cmExpandedList_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,cmValue arg,bool emptyArgs)

{
  string_view arg_00;
  bool bVar1;
  string *this;
  cmValue cStack_18;
  bool emptyArgs_local;
  cmValue arg_local;
  
  cStack_18.Value = arg.Value;
  arg_local.Value = (string *)__return_storage_ptr__;
  bVar1 = cmValue::operator_cast_to_bool(&stack0xffffffffffffffe8);
  if (bVar1) {
    this = cmValue::operator*[abi_cxx11_(&stack0xffffffffffffffe8);
    arg_00 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
    cmExpandedList_abi_cxx11_(__return_storage_ptr__,arg_00,emptyArgs);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> cmExpandedList(cmValue arg,
                                               bool emptyArgs = false)
{
  if (!arg) {
    return {};
  }
  return cmExpandedList(*arg, emptyArgs);
}